

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcentricFinder.h
# Opt level: O3

int __thiscall
ZXing::CheckSymmetricPattern<true,ZXing::FixedPattern<5,7,false>>
          (ZXing *this,BitMatrixCursorI *cur,FixedPattern<5,_7,_false> pattern,int range,
          bool updatePosition)

{
  ushort uVar1;
  long lVar2;
  uint8_t *puVar3;
  long lVar4;
  int i;
  int iVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  char *pcVar10;
  uint uVar11;
  double dVar12;
  Pattern<pattern_size()>_conflict res;
  FastEdgeToEdgeCounter curBwd;
  FastEdgeToEdgeCounter curFwd;
  undefined1 local_98 [24];
  int local_80;
  uint local_7c;
  int local_78;
  int local_74;
  FastEdgeToEdgeCounter local_70;
  BitMatrixCursorI *local_60;
  value_type local_58;
  undefined1 local_50 [16];
  PointT<int> local_40;
  Iterator puStack_38;
  
  local_58 = pattern._data[0];
  local_60 = cur;
  FastEdgeToEdgeCounter::FastEdgeToEdgeCounter(&local_70,(BitMatrixCursorI *)this);
  local_50._0_8_ = *(undefined8 *)this;
  local_50._8_8_ = *(PointT<int> *)(this + 8);
  uVar9 = 0;
  local_40.y = -*(int *)(this + 0x14);
  local_40.x = -*(int *)(this + 0x10);
  FastEdgeToEdgeCounter::FastEdgeToEdgeCounter
            ((FastEdgeToEdgeCounter *)(local_98 + 0x10),(BitMatrixCursorI *)local_50);
  uVar11 = (uint)CONCAT62((int6)((ulong)register0x00000008 >> 0x10),pattern._data[4]);
  uVar6 = uVar11;
  if (local_70.stepsToBorder < (int)uVar11) {
    uVar6 = local_70.stepsToBorder;
  }
  uVar8 = (ulong)uVar6;
  if ((int)uVar6 < 1) {
    uVar8 = uVar9;
  }
  lVar2 = (long)local_70.stride;
  iVar5 = (int)uVar8 + 1;
  puVar3 = local_70.p;
  do {
    puVar3 = puVar3 + lVar2;
    if (uVar8 == uVar9) {
      if ((int)uVar11 < local_70.stepsToBorder) {
        return 0;
      }
      goto LAB_00189336;
    }
    uVar9 = uVar9 + 1;
  } while (*puVar3 == *local_70.p);
  iVar5 = (int)uVar9;
LAB_00189336:
  local_70.stepsToBorder = local_70.stepsToBorder - iVar5;
  local_70.p = local_70.p + iVar5 * lVar2;
  uVar6 = uVar11;
  if ((int)local_7c < (int)uVar11) {
    uVar6 = local_7c;
  }
  uVar8 = 0;
  uVar9 = (ulong)uVar6;
  if ((int)uVar6 < 1) {
    uVar9 = uVar8;
  }
  lVar4 = (long)local_80;
  local_78 = (int)uVar9 + 1;
  pcVar10 = (char *)local_98._16_8_;
  do {
    pcVar10 = pcVar10 + lVar4;
    if (uVar9 == uVar8) {
      if ((int)uVar11 < (int)local_7c) {
        return 0;
      }
      goto LAB_001893aa;
    }
    uVar8 = uVar8 + 1;
  } while (*pcVar10 == *(char *)local_98._16_8_);
  local_78 = (int)uVar8;
LAB_001893aa:
  local_7c = local_7c - local_78;
  uVar6 = (iVar5 + local_78) - 1;
  local_98._16_8_ = local_98._16_8_ + local_78 * lVar4;
  local_98._8_2_ = 0;
  local_98._0_8_ = (ulong)(ushort)uVar6 << 0x20;
  uVar11 = uVar11 - (uVar6 & 0xffff);
  lVar7 = 1;
  do {
    uVar6 = uVar11;
    if (local_70.stepsToBorder < (int)uVar11) {
      uVar6 = local_70.stepsToBorder;
    }
    if ((int)uVar6 < 1) {
      uVar6 = 0;
    }
    iVar5 = uVar6 + 1;
    uVar9 = 0;
    puVar3 = local_70.p;
    do {
      puVar3 = puVar3 + lVar2;
      if (uVar6 == uVar9) {
        if ((int)uVar11 < local_70.stepsToBorder) {
          return 0;
        }
        goto LAB_00189434;
      }
      uVar9 = uVar9 + 1;
    } while (*puVar3 == *local_70.p);
    iVar5 = (int)uVar9;
LAB_00189434:
    local_70.p = local_70.p + local_70.stride * iVar5;
    local_70.stepsToBorder = local_70.stepsToBorder - iVar5;
    uVar11 = uVar11 - iVar5;
    uVar6 = uVar11;
    if ((int)local_7c < (int)uVar11) {
      uVar6 = local_7c;
    }
    uVar9 = (ulong)uVar6;
    *(short *)(local_98 + lVar7 * 2 + 4) = (short)iVar5;
    if ((int)uVar6 < 1) {
      uVar9 = 0;
    }
    iVar5 = (int)uVar9 + 1;
    uVar8 = 0;
    pcVar10 = (char *)local_98._16_8_;
    do {
      pcVar10 = pcVar10 + lVar4;
      if (uVar9 == uVar8) {
        if ((int)uVar11 < (int)local_7c) {
          return 0;
        }
        goto LAB_00189494;
      }
      uVar8 = uVar8 + 1;
    } while (*pcVar10 == *(char *)local_98._16_8_);
    iVar5 = (int)uVar8;
LAB_00189494:
    local_98._16_8_ = local_98._16_8_ + (long)(local_80 * iVar5);
    local_7c = local_7c - iVar5;
    *(short *)(local_98 + (uint)((2 - (int)lVar7) * 2)) = (short)iVar5;
    uVar11 = uVar11 - iVar5;
    lVar7 = lVar7 + 1;
    if (lVar7 == 3) {
      local_50._8_4_ = 5;
      local_40.x = 0;
      local_40.y = 0;
      puStack_38 = (Iterator)0x0;
      uVar6 = 0;
      local_74 = range;
      local_50._0_8_ = (BitMatrix *)local_98;
      dVar12 = IsPattern<true,5,7>((PatternView *)local_50,(FixedPattern<5,_7,_false> *)&local_60,0,
                                   0.0,0.0);
      if ((dVar12 != 0.0) || (NAN(dVar12))) {
        if ((char)local_74 != '\0') {
          BitMatrixCursor<ZXing::PointT<int>_>::step
                    ((BitMatrixCursor<ZXing::PointT<int>_> *)this,
                     ((uint)((ushort)local_98._4_2_ >> 1) - local_78) + 1);
        }
        lVar2 = 0;
        uVar1 = 0;
        do {
          uVar1 = uVar1 + *(short *)(local_98 + lVar2);
          lVar2 = lVar2 + 2;
        } while (lVar2 != 10);
        uVar6 = (uint)uVar1;
      }
      return uVar6;
    }
  } while( true );
}

Assistant:

int CheckSymmetricPattern(BitMatrixCursorI& cur, PATTERN pattern, int range, bool updatePosition)
{
	FastEdgeToEdgeCounter curFwd(cur), curBwd(cur.turnedBack());

	int centerFwd = curFwd.stepToNextEdge(range);
	if (!centerFwd)
		return 0;
	int centerBwd = curBwd.stepToNextEdge(range);
	if (!centerBwd)
		return 0;

	assert(range > 0);
	Pattern<pattern.size()> res = {};
	auto constexpr s_2 = Size(res)/2;
	res[s_2] = centerFwd + centerBwd - 1; // -1 because the starting pixel is counted twice
	range -= res[s_2];

	auto next = [&](auto& cur, int i) {
		auto v = cur.stepToNextEdge(range);
		res[s_2 + i] = v;
		range -= v;
		return v;
	};

	for (int i = 1; i <= s_2; ++i) {
		if (!next(curFwd, i) || !next(curBwd, -i))
			return 0;
	}

	if (!IsPattern<RELAXED_THRESHOLD>(res, pattern))
		return 0;

	if (updatePosition)
		cur.step(res[s_2] / 2 - (centerBwd - 1));

	return Reduce(res);
}